

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O2

void Lodtalk::setCurrentContext(VMContext *context)

{
  VMContext *this;
  long lVar1;
  
  lVar1 = __tls_get_addr(&PTR_00171980);
  this = *(VMContext **)(lVar1 + 8);
  *(VMContext **)(lVar1 + 8) = context;
  if (this != context) {
    if (this != (VMContext *)0x0) {
      VMContext::unregisterThreadForGC(this);
    }
    if (context != (VMContext *)0x0) {
      VMContext::registerThreadForGC(context);
      return;
    }
  }
  return;
}

Assistant:

LODTALK_VM_EXPORT void setCurrentContext(VMContext *context)
{
    auto oldContext = currentContext;
    currentContext = context;

    if(oldContext != context)
    {
        if(oldContext)
            oldContext->unregisterThreadForGC();
        if(context)
            context->registerThreadForGC();
    }
}